

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorInitializer.cxx
# Opt level: O1

void cmQtAutoGeneratorInitializer::SetupAutoGenerateTarget(cmGeneratorTarget *target)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  const_iterator __position;
  cmMakefile *pcVar2;
  cmSourceFile *pcVar3;
  pointer pcVar4;
  undefined8 uVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  PolicyStatus PVar10;
  FileFormat FVar11;
  undefined4 uVar12;
  cmGlobalGenerator *pcVar13;
  mapped_type *pmVar14;
  undefined4 extraout_var;
  string *psVar15;
  char *pcVar16;
  cmMakefile *pcVar17;
  cmGeneratorTarget *pcVar18;
  size_t sVar19;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var20;
  char **ppcVar21;
  ostream *poVar22;
  _Base_ptr p_Var23;
  PolicyID id;
  pointer pbVar24;
  char cVar25;
  _Alloc_hider _Var26;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  char *pcVar27;
  pointer ppcVar28;
  value_type *__x;
  byte bVar29;
  pointer __v;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar30;
  string infoFile;
  size_type __dnew_3;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> srcFiles;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uiFileFiles;
  string cfg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> uiFilesWithOptions;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uiFileOptions;
  string qtMajorVersion;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uicSkipList;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> srcFiles_1;
  string config;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rccFileFiles;
  string autogenTargetName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  mocSkipList;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  headers;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sources;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rccOptionsTarget;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rccFileOptions;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  configUicOptions;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  configMocDefines;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  configMocIncludes;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  configSuffix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a8;
  char local_581;
  cmGeneratorTarget *local_580;
  undefined1 local_578 [46];
  byte local_54a;
  byte local_549;
  string local_548;
  cmMakefile *local_520;
  undefined1 local_518 [40];
  cmMakefile *local_4f0;
  allocator local_4e1;
  cmMakefile *local_4e0;
  undefined1 local_4d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4c8;
  _Base_ptr local_4b8;
  size_t local_4b0;
  ios_base local_468 [136];
  ios_base local_3e0 [264];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2b8;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> local_298;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_278;
  uint local_258;
  cmNewLineStyle local_254;
  string local_250;
  undefined8 local_230;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_228;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> local_208;
  string local_1e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c8;
  string local_1a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_188;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_168;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_148;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_128;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_f0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  pcVar2 = target->Target->Makefile;
  local_580 = target;
  cmMakefile::PushScope(pcVar2);
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  local_1e8._M_string_length = 0;
  local_1e8.field_2._M_local_buf[0] = '\0';
  local_2d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (key_type *)0x0;
  local_2d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (key_type *)0x0;
  local_4e0 = pcVar2;
  cmMakefile::GetConfigurations((string *)local_4d8,pcVar2,&local_2d8,true);
  std::__cxx11::string::_M_assign((string *)&local_1e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8._0_8_ != &local_4c8) {
    operator_delete((void *)local_4d8._0_8_,
                    CONCAT17(local_4c8._M_local_buf[7],
                             CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                      CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                               local_4c8._M_local_buf[0]))) + 1);
  }
  if (local_2d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_2d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_4d8._8_8_ = (char *)0x0;
    local_4c8._M_local_buf[0] = '\0';
    local_4d8._0_8_ = &local_4c8;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2d8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d8._0_8_ != &local_4c8) {
      operator_delete((void *)local_4d8._0_8_,
                      CONCAT17(local_4c8._M_local_buf[7],
                               CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                        CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                                 local_4c8._M_local_buf[0]))) + 1);
    }
  }
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c0._M_impl.super__Rb_tree_header._M_header;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_f0._M_impl.super__Rb_tree_header._M_header;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_f0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_f0._M_impl.super__Rb_tree_header._M_header._M_left;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  pcVar13 = cmGeneratorTarget::GetGlobalGenerator(local_580);
  iVar9 = (*pcVar13->_vptr_cmGlobalGenerator[0x1f])(pcVar13);
  if (((char)iVar9 != '\0') &&
     (local_2d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_2d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    pbVar24 = local_2d8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      std::operator+(&local_5a8,"_",pbVar24);
      cmOutputConverter::EscapeForCMake((string *)local_4d8,&local_5a8);
      pmVar14 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_60,pbVar24);
      std::__cxx11::string::operator=((string *)pmVar14,(string *)local_4d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d8._0_8_ != &local_4c8) {
        operator_delete((void *)local_4d8._0_8_,
                        CONCAT17(local_4c8._M_local_buf[7],
                                 CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                          CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                                   local_4c8._M_local_buf[0]))) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
        operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
      }
      pbVar24 = pbVar24 + 1;
    } while (pbVar24 !=
             local_2d8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_4d8._0_8_ = &local_4c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4d8,"AUTOMOC","");
  local_549 = cmGeneratorTarget::GetPropertyAsBool(local_580,(string *)local_4d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8._0_8_ != &local_4c8) {
    operator_delete((void *)local_4d8._0_8_,
                    CONCAT17(local_4c8._M_local_buf[7],
                             CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                      CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                               local_4c8._M_local_buf[0]))) + 1);
  }
  local_4d8._0_8_ = &local_4c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4d8,"AUTOUIC","");
  local_54a = cmGeneratorTarget::GetPropertyAsBool(local_580,(string *)local_4d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8._0_8_ != &local_4c8) {
    operator_delete((void *)local_4d8._0_8_,
                    CONCAT17(local_4c8._M_local_buf[7],
                             CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                      CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                               local_4c8._M_local_buf[0]))) + 1);
  }
  local_4d8._0_8_ = &local_4c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4d8,"AUTORCC","");
  bVar6 = cmGeneratorTarget::GetPropertyAsBool(local_580,(string *)local_4d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8._0_8_ != &local_4c8) {
    operator_delete((void *)local_4d8._0_8_,
                    CONCAT17(local_4c8._M_local_buf[7],
                             CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                      CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                               local_4c8._M_local_buf[0]))) + 1);
  }
  pcVar18 = local_580;
  GetAutogenTargetName_abi_cxx11_(&local_1a8,local_580);
  GetQtMajorVersion_abi_cxx11_(&local_250,pcVar18);
  local_148.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_168.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_168.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((byte)(local_549 | local_54a | bVar6) != 1) goto LAB_002d6d2d;
  local_188.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_4c8._M_local_buf[0] = 'A';
  local_4c8._M_allocated_capacity._1_2_ = 0x5455;
  local_4c8._M_allocated_capacity._3_4_ = 0x434f4d4f;
  local_4d8._8_8_ = 7;
  local_4c8._M_local_buf[7] = '\0';
  local_4d8._0_8_ = &local_4c8;
  bVar7 = cmGeneratorTarget::GetPropertyAsBool(local_580,(string *)local_4d8);
  local_520 = (cmMakefile *)CONCAT71(local_520._1_7_,bVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8._0_8_ != &local_4c8) {
    operator_delete((void *)local_4d8._0_8_,
                    CONCAT17(local_4c8._M_local_buf[7],
                             CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                      CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                               local_4c8._M_local_buf[0]))) + 1);
  }
  local_4c8._M_local_buf[0] = 'A';
  local_4c8._M_allocated_capacity._1_2_ = 0x5455;
  local_4c8._M_allocated_capacity._3_4_ = 0x4349554f;
  local_4d8._8_8_ = (char *)0x7;
  local_4c8._M_local_buf[7] = '\0';
  local_4d8._0_8_ = &local_4c8;
  bVar7 = cmGeneratorTarget::GetPropertyAsBool(local_580,(string *)local_4d8);
  local_4f0 = (cmMakefile *)CONCAT71(local_4f0._1_7_,bVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8._0_8_ != &local_4c8) {
    operator_delete((void *)local_4d8._0_8_,
                    CONCAT17(local_4c8._M_local_buf[7],
                             CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                      CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                               local_4c8._M_local_buf[0]))) + 1);
  }
  pcVar18 = local_580;
  PVar10 = cmMakefile::GetPolicyStatus(local_580->Makefile,CMP0071);
  local_230 = CONCAT44(extraout_var,PVar10);
  local_548._M_dataplus._M_p = (pointer)0x0;
  local_548._M_string_length = 0;
  local_548.field_2._M_local_buf[0] = '\0';
  local_548.field_2._M_local_buf[1] = '\0';
  local_548.field_2._M_allocated_capacity._2_5_ = 0;
  local_548.field_2._M_local_buf[7] = '\0';
  local_581 = bVar6;
  cmGeneratorTarget::GetConfigCommonSourceFiles
            (pcVar18,(vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&local_548);
  if (local_548._M_dataplus._M_p != (pointer)local_548._M_string_length) {
    local_520 = (cmMakefile *)((ulong)local_520 ^ 1);
    local_258 = (int)local_230 - 2;
    _Var26._M_p = local_548._M_dataplus._M_p;
    do {
      pcVar3 = *(cmSourceFile **)_Var26._M_p;
      psVar15 = cmSourceFile::GetExtension_abi_cxx11_(pcVar3);
      FVar11 = cmSystemTools::GetFileFormat((psVar15->_M_dataplus)._M_p);
      if ((FVar11 == CXX_FILE_FORMAT) || (FVar11 == HEADER_FILE_FORMAT)) {
        psVar15 = cmSourceFile::GetFullPath(pcVar3,(string *)0x0);
        cmsys::SystemTools::GetRealPath(&local_5a8,psVar15,(string *)0x0);
        local_4d8._0_8_ = &local_4c8;
        local_4c8._M_local_buf[0] = 'S';
        local_4c8._M_allocated_capacity._1_2_ = 0x494b;
        local_4c8._M_allocated_capacity._3_4_ = 0x55415f50;
        local_4c8._M_local_buf[7] = 'T';
        local_4c8._M_local_buf[8] = 'O';
        local_4c8._M_local_buf[9] = 'G';
        local_4c8._10_2_ = 0x4e45;
        local_4d8._8_8_ = (char *)0xc;
        local_4c8._M_local_buf[0xc] = '\0';
        pcVar16 = cmSourceFile::GetPropertyForUser(pcVar3,(string *)local_4d8);
        bVar6 = cmSystemTools::IsOn(pcVar16);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4d8._0_8_ != &local_4c8) {
          operator_delete((void *)local_4d8._0_8_,
                          CONCAT17(local_4c8._M_local_buf[7],
                                   CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                            CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                                     local_4c8._M_local_buf[0]))) + 1);
        }
        bVar8 = true;
        bVar7 = true;
        if (!bVar6) {
          local_4d8._0_8_ = &local_4c8;
          local_4c8._M_local_buf[0] = 'S';
          local_4c8._M_allocated_capacity._1_2_ = 0x494b;
          local_4c8._M_allocated_capacity._3_4_ = 0x55415f50;
          local_4c8._M_local_buf[7] = 'T';
          local_4c8._M_local_buf[8] = 'O';
          local_4c8._M_local_buf[9] = 'M';
          local_4c8._10_2_ = 0x434f;
          local_4d8._8_8_ = (char *)0xc;
          local_4c8._M_local_buf[0xc] = '\0';
          pcVar16 = cmSourceFile::GetPropertyForUser(pcVar3,(string *)local_4d8);
          bVar7 = cmSystemTools::IsOn(pcVar16);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4d8._0_8_ != &local_4c8) {
            operator_delete((void *)local_4d8._0_8_,
                            CONCAT17(local_4c8._M_local_buf[7],
                                     CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                              CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                                       local_4c8._M_local_buf[0]))) + 1);
          }
        }
        if (!bVar6) {
          local_4d8._0_8_ = &local_4c8;
          local_4c8._M_local_buf[0] = 'S';
          local_4c8._M_allocated_capacity._1_2_ = 0x494b;
          local_4c8._M_allocated_capacity._3_4_ = 0x55415f50;
          local_4c8._M_local_buf[7] = 'T';
          local_4c8._M_local_buf[8] = 'O';
          local_4c8._M_local_buf[9] = 'U';
          local_4c8._10_2_ = 0x4349;
          local_4d8._8_8_ = (char *)0xc;
          local_4c8._M_local_buf[0xc] = '\0';
          pcVar16 = cmSourceFile::GetPropertyForUser(pcVar3,(string *)local_4d8);
          bVar8 = cmSystemTools::IsOn(pcVar16);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4d8._0_8_ != &local_4c8) {
            operator_delete((void *)local_4d8._0_8_,
                            CONCAT17(local_4c8._M_local_buf[7],
                                     CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                              CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                                       local_4c8._M_local_buf[0]))) + 1);
          }
        }
        bVar29 = 1;
        if ((bVar7 | (byte)local_520) == 1) {
          bVar29 = (bVar8 ^ 1U) & (byte)local_4f0;
        }
        if (bVar29 == 0) {
LAB_002d502f:
          if (bVar7 != false) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&local_188,&local_5a8);
          }
          if (bVar8 != false) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&local_228,&local_5a8);
          }
          if (bVar29 != 0) {
            this = &local_148;
            if (FVar11 != CXX_FILE_FORMAT) {
              if (FVar11 != HEADER_FILE_FORMAT) goto LAB_002d5086;
              this = &local_168;
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(this,&local_5a8);
          }
        }
        else {
          local_4d8._0_8_ = &local_4c8;
          local_4c8._M_local_buf[0] = 'G';
          local_4c8._M_allocated_capacity._1_2_ = 0x4e45;
          local_4c8._M_allocated_capacity._3_4_ = 0x54415245;
          local_4c8._M_local_buf[7] = 'E';
          local_4c8._M_local_buf[8] = 'D';
          local_4d8._8_8_ = (char *)0x9;
          local_4c8._M_local_buf[9] = '\0';
          pcVar16 = cmSourceFile::GetPropertyForUser(pcVar3,(string *)local_4d8);
          bVar6 = cmSystemTools::IsOn(pcVar16);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4d8._0_8_ != &local_4c8) {
            operator_delete((void *)local_4d8._0_8_,
                            CONCAT17(local_4c8._M_local_buf[7],
                                     CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                              CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                                       local_4c8._M_local_buf[0]))) + 1);
          }
          if ((!bVar6) || (local_258 < 3)) goto LAB_002d502f;
          if ((int)local_230 == 1) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4d8);
            cmPolicies::GetPolicyWarning_abi_cxx11_((string *)local_578,(cmPolicies *)0x47,id);
            poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_4d8,(char *)local_578._0_8_,local_578._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar22,"\n",1);
            if ((string *)local_578._0_8_ != (string *)(local_578 + 0x10)) {
              operator_delete((void *)local_578._0_8_,local_578._16_8_ + 1);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4d8,"AUTOMOC/AUTOUIC: Ignoring GENERATED source file:\n",
                       0x31);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4d8,"  ",2);
            cmQtAutoGeneratorCommon::Quoted((string *)local_578,&local_5a8);
            poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_4d8,(char *)local_578._0_8_,local_578._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar22,"\n",1);
            if ((string *)local_578._0_8_ != (string *)(local_578 + 0x10)) {
              operator_delete((void *)local_578._0_8_,local_578._16_8_ + 1);
            }
            pcVar2 = local_580->Makefile;
            std::__cxx11::stringbuf::str();
            cmMakefile::IssueMessage(pcVar2,AUTHOR_WARNING,(string *)local_578);
            if ((string *)local_578._0_8_ != (string *)(local_578 + 0x10)) {
              operator_delete((void *)local_578._0_8_,local_578._16_8_ + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4d8);
            std::ios_base::~ios_base(local_468);
          }
        }
LAB_002d5086:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
          operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
        }
      }
      _Var26._M_p = _Var26._M_p + 8;
    } while (_Var26._M_p != (pointer)local_548._M_string_length);
  }
  cVar25 = local_581;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_548._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_548._M_dataplus._M_p,
                    CONCAT17(local_548.field_2._M_local_buf[7],
                             CONCAT52(local_548.field_2._M_allocated_capacity._2_5_,
                                      CONCAT11(local_548.field_2._M_local_buf[1],
                                               local_548.field_2._M_local_buf[0]))) -
                    (long)local_548._M_dataplus._M_p);
  }
  pcVar18 = local_580;
  if (local_549 != 0) {
    local_520 = (cmMakefile *)cmGeneratorTarget::GetLocalGenerator(local_580);
    pcVar2 = pcVar18->Target->Makefile;
    GetSafeProperty_abi_cxx11_((string *)local_4d8,pcVar18,"AUTOMOC_MOC_OPTIONS");
    AddDefinitionEscaped(pcVar2,"_moc_options",(string *)local_4d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d8._0_8_ != &local_4c8) {
      operator_delete((void *)local_4d8._0_8_,
                      CONCAT17(local_4c8._M_local_buf[7],
                               CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                        CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                                 local_4c8._M_local_buf[0]))) + 1);
    }
    AddDefinitionEscaped(pcVar2,"_moc_skip",&local_188);
    paVar1 = &local_5a8.field_2;
    local_5a8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_5a8,"CMAKE_AUTOMOC_RELAXED_MODE","");
    bVar6 = cmMakefile::IsOn(pcVar2,&local_5a8);
    pcVar16 = "FALSE";
    if (bVar6) {
      pcVar16 = "TRUE";
    }
    local_4d8._0_8_ = &local_4c8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_4d8,pcVar16,pcVar16 + ((ulong)bVar6 ^ 5));
    AddDefinitionEscaped(pcVar2,"_moc_relaxed_mode",(string *)local_4d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d8._0_8_ != &local_4c8) {
      operator_delete((void *)local_4d8._0_8_,
                      CONCAT17(local_4c8._M_local_buf[7],
                               CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                        CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                                 local_4c8._M_local_buf[0]))) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
    }
    GetSafeProperty_abi_cxx11_((string *)local_4d8,local_580,"AUTOMOC_DEPEND_FILTERS");
    AddDefinitionEscaped(pcVar2,"_moc_depend_filters",(string *)local_4d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d8._0_8_ != &local_4c8) {
      operator_delete((void *)local_4d8._0_8_,
                      CONCAT17(local_4c8._M_local_buf[7],
                               CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                        CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                                 local_4c8._M_local_buf[0]))) + 1);
    }
    pcVar17 = local_580->Target->Makefile;
    local_578._0_8_ = local_578 + 0x10;
    local_578._8_8_ = (string *)0x0;
    local_578._16_8_ = local_578._16_8_ & 0xffffffffffffff00;
    iVar9 = std::__cxx11::string::compare((char *)&local_250);
    if (iVar9 == 0) {
      local_4d8._0_8_ = &local_4c8;
      local_5a8._M_dataplus._M_p = (char *)0x15;
      local_4d8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_4d8,(ulong)&local_5a8);
      local_4c8._M_local_buf[0] = (char)local_5a8._M_dataplus._M_p;
      local_4c8._M_allocated_capacity._1_2_ = (undefined2)((ulong)local_5a8._M_dataplus._M_p >> 8);
      local_4c8._M_allocated_capacity._3_4_ =
           (undefined4)((ulong)local_5a8._M_dataplus._M_p >> 0x18);
      local_4c8._M_local_buf[7] = (char)((ulong)local_5a8._M_dataplus._M_p >> 0x38);
      *(undefined8 *)local_4d8._0_8_ = 0x5f65726f43357451;
      *(char *)(local_4d8._0_8_ + 8) = 'V';
      *(char *)(local_4d8._0_8_ + 9) = 'E';
      *(char *)(local_4d8._0_8_ + 10) = 'R';
      *(char *)(local_4d8._0_8_ + 0xb) = 'S';
      *(char *)(local_4d8._0_8_ + 0xc) = 'I';
      *(char *)(local_4d8._0_8_ + 0xd) = 'O';
      *(char *)(local_4d8._0_8_ + 0xe) = 'N';
      *(char *)(local_4d8._0_8_ + 0xf) = '_';
      *(char *)(local_4d8._0_8_ + 0xd) = 'O';
      *(char *)(local_4d8._0_8_ + 0xe) = 'N';
      *(char *)(local_4d8._0_8_ + 0xf) = '_';
      *(char *)(local_4d8._0_8_ + 0x10) = 'M';
      *(char *)(local_4d8._0_8_ + 0x11) = 'I';
      *(char *)(local_4d8._0_8_ + 0x12) = 'N';
      *(char *)(local_4d8._0_8_ + 0x13) = 'O';
      *(char *)(local_4d8._0_8_ + 0x14) = 'R';
      local_4d8._8_8_ = local_5a8._M_dataplus._M_p;
      *(char *)(local_4d8._0_8_ + (long)local_5a8._M_dataplus._M_p) = '\0';
      pcVar16 = cmMakefile::GetSafeDefinition(pcVar17,(string *)local_4d8);
      uVar5 = local_578._8_8_;
      strlen(pcVar16);
      std::__cxx11::string::_M_replace((ulong)local_578,0,(char *)uVar5,(ulong)pcVar16);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d8._0_8_ != &local_4c8) {
        operator_delete((void *)local_4d8._0_8_,
                        CONCAT17(local_4c8._M_local_buf[7],
                                 CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                          CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                                   local_4c8._M_local_buf[0]))) + 1);
      }
    }
    if ((string *)local_578._8_8_ == (string *)0x0) {
      local_4d8._0_8_ = &local_4c8;
      local_5a8._M_dataplus._M_p = (char *)0x10;
      local_4d8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_4d8,(ulong)&local_5a8);
      local_4c8._M_local_buf[0] = (char)local_5a8._M_dataplus._M_p;
      local_4c8._M_allocated_capacity._1_2_ = (undefined2)((ulong)local_5a8._M_dataplus._M_p >> 8);
      local_4c8._M_allocated_capacity._3_4_ =
           (undefined4)((ulong)local_5a8._M_dataplus._M_p >> 0x18);
      local_4c8._M_local_buf[7] = (char)((ulong)local_5a8._M_dataplus._M_p >> 0x38);
      *(undefined8 *)local_4d8._0_8_ = 0x49535245565f5451;
      *(char *)(local_4d8._0_8_ + 8) = 'O';
      *(char *)(local_4d8._0_8_ + 9) = 'N';
      *(char *)(local_4d8._0_8_ + 10) = '_';
      *(char *)(local_4d8._0_8_ + 0xb) = 'M';
      *(char *)(local_4d8._0_8_ + 0xc) = 'I';
      *(char *)(local_4d8._0_8_ + 0xd) = 'N';
      *(char *)(local_4d8._0_8_ + 0xe) = 'O';
      *(char *)(local_4d8._0_8_ + 0xf) = 'R';
      local_4d8._8_8_ = local_5a8._M_dataplus._M_p;
      *(char *)(local_4d8._0_8_ + (long)local_5a8._M_dataplus._M_p) = '\0';
      pcVar16 = cmMakefile::GetSafeDefinition(pcVar17,(string *)local_4d8);
      uVar5 = local_578._8_8_;
      strlen(pcVar16);
      std::__cxx11::string::_M_replace((ulong)local_578,0,(char *)uVar5,(ulong)pcVar16);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d8._0_8_ != &local_4c8) {
        operator_delete((void *)local_4d8._0_8_,
                        CONCAT17(local_4c8._M_local_buf[7],
                                 CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                          CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                                   local_4c8._M_local_buf[0]))) + 1);
      }
    }
    local_4d8._0_8_ = &local_4c8;
    local_5a8._M_dataplus._M_p = (pointer)0x10;
    local_4d8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_4d8,(ulong)&local_5a8);
    local_4c8._M_local_buf[0] = (char)local_5a8._M_dataplus._M_p;
    local_4c8._M_allocated_capacity._1_2_ = (undefined2)((ulong)local_5a8._M_dataplus._M_p >> 8);
    local_4c8._M_allocated_capacity._3_4_ = (undefined4)((ulong)local_5a8._M_dataplus._M_p >> 0x18);
    local_4c8._M_local_buf[7] = (char)((ulong)local_5a8._M_dataplus._M_p >> 0x38);
    *(undefined8 *)local_4d8._0_8_ = 0x524f4e494d5f5451;
    *(char *)(local_4d8._0_8_ + 8) = '_';
    *(char *)(local_4d8._0_8_ + 9) = 'V';
    *(char *)(local_4d8._0_8_ + 10) = 'E';
    *(char *)(local_4d8._0_8_ + 0xb) = 'R';
    *(char *)(local_4d8._0_8_ + 0xc) = 'S';
    *(char *)(local_4d8._0_8_ + 0xd) = 'I';
    *(char *)(local_4d8._0_8_ + 0xe) = 'O';
    *(char *)(local_4d8._0_8_ + 0xf) = 'N';
    local_4d8._8_8_ = local_5a8._M_dataplus._M_p;
    *(char *)(local_4d8._0_8_ + (long)local_5a8._M_dataplus._M_p) = '\0';
    local_5a8._M_string_length = 0;
    local_5a8.field_2._M_allocated_capacity =
         local_5a8.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_5a8._M_dataplus._M_p = (pointer)paVar1;
    pcVar16 = cmGeneratorTarget::GetLinkInterfaceDependentStringProperty
                        (local_580,(string *)local_4d8,&local_5a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_5a8._M_dataplus._M_p,
                      (ulong)(local_5a8.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d8._0_8_ != &local_4c8) {
      operator_delete((void *)local_4d8._0_8_,
                      CONCAT17(local_4c8._M_local_buf[7],
                               CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                        CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                                 local_4c8._M_local_buf[0]))) + 1);
    }
    uVar5 = local_578._8_8_;
    if (pcVar16 != (char *)0x0) {
      strlen(pcVar16);
      std::__cxx11::string::_M_replace((ulong)local_578,0,(char *)uVar5,(ulong)pcVar16);
    }
    local_4d8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_5a8._M_dataplus._M_p = (pointer)0x0;
    bVar6 = cmSystemTools::StringToULong(local_250._M_dataplus._M_p,(unsigned_long *)local_4d8);
    if ((bVar6) &&
       (bVar6 = cmSystemTools::StringToULong((char *)local_578._0_8_,(unsigned_long *)&local_5a8),
       bVar6)) {
      bVar6 = true;
      if ((ulong)local_4d8._0_8_ <
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x6) {
        bVar6 = (pointer)0x7 < local_5a8._M_dataplus._M_p &&
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4d8._0_8_ ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x5;
      }
    }
    else {
      bVar6 = false;
    }
    if ((string *)local_578._0_8_ != (string *)(local_578 + 0x10)) {
      operator_delete((void *)local_578._0_8_,local_578._16_8_ + 1);
    }
    if (bVar6) {
      local_578._0_8_ = (string *)0x25;
      local_5a8._M_dataplus._M_p = (pointer)paVar1;
      local_5a8._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_5a8,(ulong)local_578);
      local_5a8.field_2._M_allocated_capacity = local_578._0_8_;
      builtin_strncpy(local_5a8._M_dataplus._M_p,"CMAKE_CXX_COMPILER_PREDEFINES_COMMAND",0x25);
      local_5a8._M_string_length = local_578._0_8_;
      local_5a8._M_dataplus._M_p[local_578._0_8_] = '\0';
      pcVar16 = cmMakefile::GetSafeDefinition(pcVar2,&local_5a8);
      std::__cxx11::string::string((string *)local_4d8,pcVar16,(allocator *)local_578);
      AddDefinitionEscaped(pcVar2,"_moc_predefs_cmd",(string *)local_4d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d8._0_8_ != &local_4c8) {
        operator_delete((void *)local_4d8._0_8_,
                        CONCAT17(local_4c8._M_local_buf[7],
                                 CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                          CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                                   local_4c8._M_local_buf[0]))) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_5a8._M_dataplus._M_p,
                        (ulong)(local_5a8.field_2._M_allocated_capacity + 1));
      }
    }
    local_4d8._0_8_ = &local_4c8;
    local_4d8._8_8_ = (string *)0x0;
    local_4c8._M_local_buf[0] = '\0';
    local_5a8._M_string_length = 0;
    local_5a8.field_2._M_allocated_capacity =
         local_5a8.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_5a8._M_dataplus._M_p = (pointer)paVar1;
    GetCompileDefinitionsAndDirectories(local_580,&local_1e8,(string *)local_4d8,&local_5a8);
    AddDefinitionEscaped(pcVar2,"_moc_incs",(string *)local_4d8);
    AddDefinitionEscaped(pcVar2,"_moc_compile_defs",&local_5a8);
    local_4f0 = pcVar2;
    if (local_2d8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_2d8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar24 = local_2d8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_578._0_8_ = local_578 + 0x10;
        local_578._8_8_ = (string *)0x0;
        local_578._16_8_ = local_578._16_8_ & 0xffffffffffffff00;
        local_548._M_string_length = 0;
        local_548.field_2._M_local_buf[0] = '\0';
        local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
        GetCompileDefinitionsAndDirectories(local_580,pbVar24,(string *)local_578,&local_548);
        if ((local_578._8_8_ != local_4d8._8_8_) ||
           (((string *)local_578._8_8_ != (string *)0x0 &&
            (iVar9 = bcmp((void *)local_578._0_8_,(void *)local_4d8._0_8_,local_578._8_8_),
            iVar9 != 0)))) {
          cmOutputConverter::EscapeForCMake((string *)local_518,(string *)local_578);
          pmVar14 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&local_90,pbVar24);
          std::__cxx11::string::operator=((string *)pmVar14,(string *)local_518);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_518._0_8_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_518 + 0x10)) {
            operator_delete((void *)local_518._0_8_,local_518._16_8_ + 1);
          }
        }
        if ((local_548._M_string_length != local_5a8._M_string_length) ||
           (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_548._M_string_length !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0 &&
            (iVar9 = bcmp(local_548._M_dataplus._M_p,local_5a8._M_dataplus._M_p,
                          local_548._M_string_length), iVar9 != 0)))) {
          cmOutputConverter::EscapeForCMake((string *)local_518,&local_548);
          pmVar14 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&local_c0,pbVar24);
          std::__cxx11::string::operator=((string *)pmVar14,(string *)local_518);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_518._0_8_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_518 + 0x10)) {
            operator_delete((void *)local_518._0_8_,local_518._16_8_ + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_548._M_dataplus._M_p != &local_548.field_2) {
          operator_delete(local_548._M_dataplus._M_p,
                          CONCAT17(local_548.field_2._M_local_buf[7],
                                   CONCAT52(local_548.field_2._M_allocated_capacity._2_5_,
                                            CONCAT11(local_548.field_2._M_local_buf[1],
                                                     local_548.field_2._M_local_buf[0]))) + 1);
        }
        if ((string *)local_578._0_8_ != (string *)(local_578 + 0x10)) {
          operator_delete((void *)local_578._0_8_,local_578._16_8_ + 1);
        }
        pbVar24 = pbVar24 + 1;
      } while (pbVar24 !=
               local_2d8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    paVar1 = &local_5a8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
    }
    cVar25 = local_581;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d8._0_8_ != &local_4c8) {
      operator_delete((void *)local_4d8._0_8_,
                      CONCAT17(local_4c8._M_local_buf[7],
                               CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                        CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                                 local_4c8._M_local_buf[0]))) + 1);
    }
    local_4d8._0_8_ = &local_4c8;
    local_4d8._8_8_ = (char *)0x0;
    local_4c8._M_local_buf[0] = '\0';
    iVar9 = std::__cxx11::string::compare((char *)&local_250);
    if (iVar9 == 0) {
      local_5a8.field_2._M_allocated_capacity = 0x636f6d3a3a357451;
      local_5a8._M_string_length = 8;
      local_5a8.field_2._M_local_buf[8] = '\0';
      local_5a8._M_dataplus._M_p = (pointer)paVar1;
      pcVar18 = cmLocalGenerator::FindGeneratorTargetToUse((cmLocalGenerator *)local_520,&local_5a8)
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
      }
      if (pcVar18 != (cmGeneratorTarget *)0x0) {
        local_5a8._M_string_length = 0;
        local_5a8.field_2._M_allocated_capacity =
             local_5a8.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_5a8._M_dataplus._M_p = (pointer)paVar1;
        pcVar16 = cmGeneratorTarget::ImportedGetLocation(pcVar18,&local_5a8);
        goto LAB_002d5b54;
      }
      std::operator+(&local_5a8,"Qt5::moc target not found ",&local_1a8);
LAB_002d5ba4:
      std::__cxx11::string::operator=((string *)local_4d8,(string *)&local_5a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
      }
LAB_002d5bce:
      pcVar16 = (char *)0x0;
    }
    else {
      iVar9 = std::__cxx11::string::compare((char *)&local_250);
      if (iVar9 != 0) {
        std::__cxx11::string::_M_replace((ulong)local_4d8,0,(char *)local_4d8._8_8_,0x5516dc);
        std::__cxx11::string::_M_append(local_4d8,(ulong)local_1a8._M_dataplus._M_p);
        goto LAB_002d5bce;
      }
      local_5a8.field_2._M_allocated_capacity = 0x636f6d3a3a347451;
      local_5a8._M_string_length = 8;
      local_5a8.field_2._M_local_buf[8] = '\0';
      local_5a8._M_dataplus._M_p = (pointer)paVar1;
      pcVar18 = cmLocalGenerator::FindGeneratorTargetToUse((cmLocalGenerator *)local_520,&local_5a8)
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
      }
      if (pcVar18 == (cmGeneratorTarget *)0x0) {
        std::operator+(&local_5a8,"Qt4::moc target not found ",&local_1a8);
        goto LAB_002d5ba4;
      }
      local_5a8._M_string_length = 0;
      local_5a8.field_2._M_allocated_capacity =
           local_5a8.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_5a8._M_dataplus._M_p = (pointer)paVar1;
      pcVar16 = cmGeneratorTarget::ImportedGetLocation(pcVar18,&local_5a8);
LAB_002d5b54:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
      }
    }
    if ((char *)local_4d8._8_8_ == (char *)0x0) {
      pcVar27 = "";
      if (pcVar16 != (char *)0x0) {
        pcVar27 = pcVar16;
      }
      local_5a8._M_dataplus._M_p = (pointer)paVar1;
      sVar19 = strlen(pcVar27);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a8,pcVar27,pcVar27 + sVar19)
      ;
      AddDefinitionEscaped(local_4f0,"_qt_moc_executable",&local_5a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      cmSystemTools::Error((char *)local_4d8._0_8_,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d8._0_8_ != &local_4c8) {
      operator_delete((void *)local_4d8._0_8_,
                      CONCAT17(local_4c8._M_local_buf[7],
                               CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                        CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                                 local_4c8._M_local_buf[0]))) + 1);
    }
  }
  pcVar18 = local_580;
  if (local_54a != 0) {
    pcVar17 = (cmMakefile *)cmGeneratorTarget::GetLocalGenerator(local_580);
    pcVar2 = pcVar18->Target->Makefile;
    AddDefinitionEscaped(pcVar2,"_uic_skip",&local_228);
    local_578._0_8_ = (string *)0x0;
    local_578._8_8_ = (string *)0x0;
    local_578._16_8_ = 0;
    GetSafeProperty_abi_cxx11_((string *)local_4d8,pcVar18,"AUTOUIC_SEARCH_PATHS");
    cmSystemTools::ExpandListArgument
              ((string *)local_4d8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_578,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d8._0_8_ != &local_4c8) {
      operator_delete((void *)local_4d8._0_8_,
                      CONCAT17(local_4c8._M_local_buf[7],
                               CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                        CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                                 local_4c8._M_local_buf[0]))) + 1);
    }
    pcVar16 = cmMakefile::GetCurrentSourceDirectory(pcVar2);
    std::__cxx11::string::string((string *)local_4d8,pcVar16,(allocator *)&local_5a8);
    if (local_578._0_8_ != local_578._8_8_) {
      psVar15 = (string *)local_578._0_8_;
      do {
        cmsys::SystemTools::CollapseFullPath(&local_5a8,psVar15,(string *)local_4d8);
        std::__cxx11::string::operator=((string *)psVar15,(string *)&local_5a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
          operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
        }
        psVar15 = psVar15 + 1;
      } while (psVar15 != (string *)local_578._8_8_);
    }
    AddDefinitionEscaped
              (pcVar2,"_uic_search_paths",
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_578);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d8._0_8_ != &local_4c8) {
      operator_delete((void *)local_4d8._0_8_,
                      CONCAT17(local_4c8._M_local_buf[7],
                               CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                        CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                                 local_4c8._M_local_buf[0]))) + 1);
    }
    local_4f0 = pcVar17;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_578);
    local_4d8._0_8_ = &local_4c8;
    local_4d8._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_4c8._M_local_buf[0] = '\0';
    UicGetOpts(local_580,&local_1e8,(string *)local_4d8);
    AddDefinitionEscaped(pcVar2,"_uic_target_options",(string *)local_4d8);
    local_520 = pcVar2;
    if (local_2d8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_2d8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar24 = local_2d8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_5a8._M_string_length = 0;
        local_5a8.field_2._M_allocated_capacity =
             local_5a8.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
        UicGetOpts(local_580,pbVar24,&local_5a8);
        if ((local_5a8._M_string_length != local_4d8._8_8_) ||
           (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_5a8._M_string_length !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0 &&
            (iVar9 = bcmp(local_5a8._M_dataplus._M_p,(void *)local_4d8._0_8_,
                          local_5a8._M_string_length), iVar9 != 0)))) {
          cmOutputConverter::EscapeForCMake((string *)local_578,&local_5a8);
          pmVar14 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&local_f0,pbVar24);
          std::__cxx11::string::operator=((string *)pmVar14,(string *)local_578);
          if ((string *)local_578._0_8_ != (string *)(local_578 + 0x10)) {
            operator_delete((void *)local_578._0_8_,local_578._16_8_ + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
          operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
        }
        pbVar24 = pbVar24 + 1;
      } while (pbVar24 !=
               local_2d8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d8._0_8_ != &local_4c8) {
      operator_delete((void *)local_4d8._0_8_,
                      CONCAT17(local_4c8._M_local_buf[7],
                               CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                        CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                                 local_4c8._M_local_buf[0]))) + 1);
    }
    pbVar24 = local_228.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pcVar2 = local_520;
    local_518._16_8_ = 0;
    local_518._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_518._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_278.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_278.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_278.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    __position._M_node = (_Base_ptr)(local_4d8 + 8);
    local_4d8._8_8_ = local_4d8._8_8_ & 0xffffffff00000000;
    local_4c8._M_local_buf[0] = '\0';
    local_4c8._M_allocated_capacity._1_2_ = 0;
    local_4c8._M_allocated_capacity._3_4_ = 0;
    local_4c8._M_local_buf[7] = '\0';
    local_4c8._M_local_buf[8] = (char)__position._M_node;
    local_4c8._M_local_buf[9] = (char)((ulong)__position._M_node >> 8);
    local_4c8._10_2_ = (undefined2)((ulong)__position._M_node >> 0x10);
    local_4c8._M_local_buf[0xc] = (char)((ulong)__position._M_node >> 0x20);
    local_4c8._13_2_ = (undefined2)((ulong)__position._M_node >> 0x28);
    local_4c8._M_local_buf[0xf] = (char)((ulong)__position._M_node >> 0x38);
    local_4b0 = 0;
    local_5a8._M_dataplus._M_p = local_4d8;
    local_4b8 = __position._M_node;
    if (local_228.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_228.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      __v = local_228.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      do {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::
        _M_insert_unique_<std::__cxx11::string_const&,std::_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::_Alloc_node>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_4d8,__position,__v,(_Alloc_node *)&local_5a8);
        __v = __v + 1;
      } while (__v != pbVar24);
    }
    cmMakefile::GetQtUiFilesWithOptions(&local_298,pcVar2);
    if (local_298.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_298.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      ppcVar28 = local_298.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      do {
        pcVar3 = *ppcVar28;
        psVar15 = cmSourceFile::GetFullPath(pcVar3,(string *)0x0);
        cmsys::SystemTools::GetRealPath(&local_5a8,psVar15,(string *)0x0);
        pVar30 = std::
                 _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                 ::_M_insert_unique<std::__cxx11::string_const&>
                           ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                             *)local_4d8,&local_5a8);
        if (((undefined1  [16])pVar30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_518,&local_5a8);
          local_548.field_2._8_7_ = 0x534e4f4954504f;
          local_548.field_2._M_local_buf[0] = 'A';
          local_548.field_2._M_local_buf[1] = 'U';
          local_548.field_2._M_allocated_capacity._2_5_ = 0x4349554f54;
          local_548.field_2._M_local_buf[7] = '_';
          local_548._M_string_length = 0xf;
          local_548.field_2._M_local_buf[0xf] = '\0';
          local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
          pcVar16 = cmSourceFile::GetProperty(pcVar3,&local_548);
          std::__cxx11::string::string((string *)local_578,pcVar16,(allocator *)&local_1c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_548._M_dataplus._M_p != &local_548.field_2) {
            operator_delete(local_548._M_dataplus._M_p,
                            CONCAT17(local_548.field_2._M_local_buf[7],
                                     CONCAT52(local_548.field_2._M_allocated_capacity._2_5_,
                                              CONCAT11(local_548.field_2._M_local_buf[1],
                                                       local_548.field_2._M_local_buf[0]))) + 1);
          }
          cmsys::SystemTools::ReplaceString
                    ((string *)local_578,";",cmQtAutoGeneratorCommon::listSep);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_278,(string *)local_578);
          if ((string *)local_578._0_8_ != (string *)(local_578 + 0x10)) {
            operator_delete((void *)local_578._0_8_,local_578._16_8_ + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
          operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
        }
        ppcVar28 = ppcVar28 + 1;
      } while (ppcVar28 !=
               local_298.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl
               .super__Vector_impl_data._M_finish);
    }
    if (local_298.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_298.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_298.
                            super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_298.
                            super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_4d8);
    pcVar2 = local_520;
    AddDefinitionEscaped
              (local_520,"_qt_uic_options_files",
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_518);
    cVar25 = local_581;
    AddDefinitionEscaped(pcVar2,"_qt_uic_options_options",&local_278);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_278);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_518);
    local_4d8._0_8_ = &local_4c8;
    local_4d8._8_8_ = (char *)0x0;
    local_4c8._M_local_buf[0] = '\0';
    iVar9 = std::__cxx11::string::compare((char *)&local_250);
    if (iVar9 == 0) {
      paVar1 = &local_5a8.field_2;
      local_5a8.field_2._M_allocated_capacity = 0x6369753a3a357451;
      local_5a8._M_string_length = 8;
      local_5a8.field_2._M_local_buf[8] = '\0';
      local_5a8._M_dataplus._M_p = (pointer)paVar1;
      pcVar18 = cmLocalGenerator::FindGeneratorTargetToUse((cmLocalGenerator *)local_4f0,&local_5a8)
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
      }
      if (pcVar18 == (cmGeneratorTarget *)0x0) goto LAB_002d6382;
      local_5a8._M_string_length = 0;
      local_5a8.field_2._M_allocated_capacity =
           local_5a8.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_5a8._M_dataplus._M_p = (pointer)paVar1;
      pcVar16 = cmGeneratorTarget::ImportedGetLocation(pcVar18,&local_5a8);
LAB_002d631e:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
        operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      iVar9 = std::__cxx11::string::compare((char *)&local_250);
      if (iVar9 == 0) {
        paVar1 = &local_5a8.field_2;
        local_5a8.field_2._M_allocated_capacity = 0x6369753a3a347451;
        local_5a8._M_string_length = 8;
        local_5a8.field_2._M_local_buf[8] = '\0';
        local_5a8._M_dataplus._M_p = (pointer)paVar1;
        pcVar18 = cmLocalGenerator::FindGeneratorTargetToUse
                            ((cmLocalGenerator *)local_4f0,&local_5a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5a8._M_dataplus._M_p != paVar1) {
          operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
        }
        if (pcVar18 != (cmGeneratorTarget *)0x0) {
          local_5a8._M_string_length = 0;
          local_5a8.field_2._M_allocated_capacity =
               local_5a8.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_5a8._M_dataplus._M_p = (pointer)paVar1;
          pcVar16 = cmGeneratorTarget::ImportedGetLocation(pcVar18,&local_5a8);
          goto LAB_002d631e;
        }
        psVar15 = cmGeneratorTarget::GetName_abi_cxx11_(local_580);
        std::operator+(&local_5a8,"Qt4::uic target not found ",psVar15);
        std::__cxx11::string::operator=((string *)local_4d8,(string *)&local_5a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5a8._M_dataplus._M_p != paVar1) {
          operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        std::__cxx11::string::_M_replace((ulong)local_4d8,0,(char *)local_4d8._8_8_,0x5517ec);
        psVar15 = cmGeneratorTarget::GetName_abi_cxx11_(local_580);
        std::__cxx11::string::_M_append(local_4d8,(ulong)(psVar15->_M_dataplus)._M_p);
      }
LAB_002d6382:
      pcVar16 = (char *)0x0;
    }
    if ((char *)local_4d8._8_8_ == (char *)0x0) {
      pcVar27 = "";
      if (pcVar16 != (char *)0x0) {
        pcVar27 = pcVar16;
      }
      local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
      sVar19 = strlen(pcVar27);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a8,pcVar27,pcVar27 + sVar19)
      ;
      AddDefinitionEscaped(local_520,"_qt_uic_executable",&local_5a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
        operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      cmSystemTools::Error((char *)local_4d8._0_8_,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d8._0_8_ != &local_4c8) {
      operator_delete((void *)local_4d8._0_8_,
                      CONCAT17(local_4c8._M_local_buf[7],
                               CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                        CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                                 local_4c8._M_local_buf[0]))) + 1);
    }
  }
  pcVar18 = local_580;
  if (cVar25 != '\0') {
    local_4f0 = local_580->Target->Makefile;
    uVar12 = std::__cxx11::string::compare((char *)&local_250);
    local_520 = (cmMakefile *)CONCAT44(local_520._4_4_,uVar12);
    RccGetExecutable(&local_5a8,pcVar18,&local_250);
    local_278.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_278.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_278.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_298.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_298.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_298.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_108.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_108.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_108.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_128.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_128.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_128.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_4c8._M_local_buf[0] = 'A';
    local_4c8._M_allocated_capacity._1_2_ = 0x5455;
    local_4c8._M_allocated_capacity._3_4_ = 0x4343524f;
    local_4c8._M_local_buf[7] = '_';
    local_4c8._M_local_buf[8] = 'O';
    local_4c8._M_local_buf[9] = 'P';
    local_4c8._10_2_ = 0x4954;
    local_4c8._M_local_buf[0xc] = 'O';
    local_4c8._13_2_ = 0x534e;
    local_4d8._8_8_ = (char *)0xf;
    local_4c8._M_local_buf[0xf] = '\0';
    local_4d8._0_8_ = &local_4c8;
    pcVar16 = cmGeneratorTarget::GetProperty(pcVar18,(string *)local_4d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d8._0_8_ != &local_4c8) {
      operator_delete((void *)local_4d8._0_8_,
                      CONCAT17(local_4c8._M_local_buf[7],
                               CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                        CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                                 local_4c8._M_local_buf[0]))) + 1);
    }
    if (pcVar16 != (char *)0x0) {
      local_4d8._0_8_ = &local_4c8;
      sVar19 = strlen(pcVar16);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_4d8,pcVar16,pcVar16 + sVar19);
      cmSystemTools::ExpandListArgument((string *)local_4d8,&local_128,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d8._0_8_ != &local_4c8) {
        operator_delete((void *)local_4d8._0_8_,
                        CONCAT17(local_4c8._M_local_buf[7],
                                 CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                          CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                                   local_4c8._M_local_buf[0]))) + 1);
      }
    }
    local_208.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_208.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_208.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmGeneratorTarget::GetConfigCommonSourceFiles(local_580,&local_208);
    ppcVar28 = local_208.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    if (local_208.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_208.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        pcVar3 = *ppcVar28;
        psVar15 = cmSourceFile::GetExtension_abi_cxx11_(pcVar3);
        iVar9 = std::__cxx11::string::compare((char *)psVar15);
        if (iVar9 == 0) {
          local_4d8._0_8_ = &local_4c8;
          local_4c8._M_local_buf[0] = 'S';
          local_4c8._M_allocated_capacity._1_2_ = 0x494b;
          local_4c8._M_allocated_capacity._3_4_ = 0x55415f50;
          local_4c8._M_local_buf[7] = 'T';
          local_4c8._M_local_buf[8] = 'O';
          local_4c8._M_local_buf[9] = 'G';
          local_4c8._10_2_ = 0x4e45;
          local_4d8._8_8_ = (char *)0xc;
          local_4c8._M_local_buf[0xc] = '\0';
          pcVar16 = cmSourceFile::GetPropertyForUser(pcVar3,(string *)local_4d8);
          bVar6 = cmSystemTools::IsOn(pcVar16);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4d8._0_8_ != &local_4c8) {
            operator_delete((void *)local_4d8._0_8_,
                            CONCAT17(local_4c8._M_local_buf[7],
                                     CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                              CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                                       local_4c8._M_local_buf[0]))) + 1);
          }
          if (!bVar6) {
            local_4d8._0_8_ = &local_4c8;
            local_4c8._M_local_buf[0] = 'S';
            local_4c8._M_allocated_capacity._1_2_ = 0x494b;
            local_4c8._M_allocated_capacity._3_4_ = 0x55415f50;
            local_4c8._M_local_buf[7] = 'T';
            local_4c8._M_local_buf[8] = 'O';
            local_4c8._M_local_buf[9] = 'R';
            local_4c8._10_2_ = 0x4343;
            local_4d8._8_8_ = (char *)0xc;
            local_4c8._M_local_buf[0xc] = '\0';
            pcVar16 = cmSourceFile::GetPropertyForUser(pcVar3,(string *)local_4d8);
            bVar6 = cmSystemTools::IsOn(pcVar16);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4d8._0_8_ != &local_4c8) {
              operator_delete((void *)local_4d8._0_8_,
                              CONCAT17(local_4c8._M_local_buf[7],
                                       CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                                CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                                         local_4c8._M_local_buf[0]))) + 1);
            }
            if (!bVar6) {
              psVar15 = cmSourceFile::GetFullPath(pcVar3,(string *)0x0);
              cmsys::SystemTools::GetRealPath((string *)local_578,psVar15,(string *)0x0);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&local_278,(string *)local_578);
              local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
              local_548.field_2._M_local_buf[0] = '{';
              local_548.field_2._M_local_buf[1] = '\0';
              local_548._M_string_length = 1;
              local_4d8._0_8_ = &local_4c8;
              local_4c8._M_local_buf[0] = 'G';
              local_4c8._M_allocated_capacity._1_2_ = 0x4e45;
              local_4c8._M_allocated_capacity._3_4_ = 0x54415245;
              local_4c8._M_local_buf[7] = 'E';
              local_4c8._M_local_buf[8] = 'D';
              local_4d8._8_8_ = 9;
              local_4c8._M_local_buf[9] = '\0';
              pcVar16 = cmSourceFile::GetPropertyForUser(pcVar3,(string *)local_4d8);
              bVar6 = cmSystemTools::IsOn(pcVar16);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4d8._0_8_ != &local_4c8) {
                operator_delete((void *)local_4d8._0_8_,
                                CONCAT17(local_4c8._M_local_buf[7],
                                         CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                                  CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                                           local_4c8._M_local_buf[0]))) + 1);
              }
              if (!bVar6) {
                local_4d8._0_8_ = &local_4c8;
                local_4d8._8_8_ = 0;
                local_4c8._M_local_buf[0] = '\0';
                local_2b8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                local_2b8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (value_type *)0x0;
                local_2b8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (value_type *)0x0;
                bVar6 = cmQtAutoGeneratorCommon::RccListInputs
                                  (&local_250,&local_5a8,(string *)local_578,&local_2b8,
                                   (string *)local_4d8);
                if (bVar6) {
                  cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                            ((string *)local_518,&local_2b8,cmQtAutoGeneratorCommon::listSep);
                  std::__cxx11::string::_M_append((char *)&local_548,local_518._0_8_);
                  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_518._0_8_ !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (local_518 + 0x10)) {
                    operator_delete((void *)local_518._0_8_,local_518._16_8_ + 1);
                  }
                }
                else {
                  cmSystemTools::Error((char *)local_4d8._0_8_,(char *)0x0,(char *)0x0,(char *)0x0);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_2b8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4d8._0_8_ != &local_4c8) {
                  operator_delete((void *)local_4d8._0_8_,
                                  CONCAT17(local_4c8._M_local_buf[7],
                                           CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                                    CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                                             local_4c8._M_local_buf[0]))) + 1);
                }
              }
              std::__cxx11::string::append((char *)&local_548);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_298,&local_548);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_548._M_dataplus._M_p != &local_548.field_2) {
                operator_delete(local_548._M_dataplus._M_p,
                                CONCAT17(local_548.field_2._M_local_buf[7],
                                         CONCAT52(local_548.field_2._M_allocated_capacity._2_5_,
                                                  CONCAT11(local_548.field_2._M_local_buf[1],
                                                           local_548.field_2._M_local_buf[0]))) + 1)
                ;
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_518,&local_128);
              local_4c8._M_local_buf[8] = 'O';
              local_4c8._M_local_buf[9] = 'P';
              local_4c8._10_2_ = 0x4954;
              local_4c8._M_local_buf[0xc] = 'O';
              local_4c8._13_2_ = 0x534e;
              local_4c8._M_local_buf[0] = 'A';
              local_4c8._M_allocated_capacity._1_2_ = 0x5455;
              local_4c8._M_allocated_capacity._3_4_ = 0x4343524f;
              local_4c8._M_local_buf[7] = '_';
              local_4d8._8_8_ = (char *)0xf;
              local_4c8._M_local_buf[0xf] = '\0';
              local_4d8._0_8_ = &local_4c8;
              pcVar16 = cmSourceFile::GetProperty(pcVar3,(string *)local_4d8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4d8._0_8_ != &local_4c8) {
                operator_delete((void *)local_4d8._0_8_,
                                CONCAT17(local_4c8._M_local_buf[7],
                                         CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                                  CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                                           local_4c8._M_local_buf[0]))) + 1);
              }
              if (pcVar16 != (char *)0x0) {
                local_2b8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (value_type *)0x0;
                local_2b8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (value_type *)0x0;
                local_2b8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                local_4d8._0_8_ = &local_4c8;
                sVar19 = strlen(pcVar16);
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_4d8,pcVar16,pcVar16 + sVar19);
                cmSystemTools::ExpandListArgument((string *)local_4d8,&local_2b8,false);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4d8._0_8_ != &local_4c8) {
                  operator_delete((void *)local_4d8._0_8_,
                                  CONCAT17(local_4c8._M_local_buf[7],
                                           CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                                    CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                                             local_4c8._M_local_buf[0]))) + 1);
                }
                local_548._M_dataplus._M_p = (pointer)0x0;
                local_548._M_string_length = 0;
                local_548.field_2._M_local_buf[0] = '\0';
                local_548.field_2._M_local_buf[1] = '\0';
                local_548.field_2._M_allocated_capacity._2_5_ = 0;
                local_548.field_2._M_local_buf[7] = '\0';
                for (__x = local_2b8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                    __x != local_2b8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish; __x = __x + 1) {
                  _Var20 = std::
                           __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                                     (local_518._0_8_,local_518._8_8_,__x);
                  if (_Var20._M_current ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_518._8_8_) {
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&local_548,__x);
                  }
                  else {
                    pcVar16 = (__x->_M_dataplus)._M_p;
                    pcVar27 = pcVar16;
                    if (*pcVar16 == '-') {
                      pcVar27 = pcVar16 + 1;
                      if (((int)local_520 == 0) && (pcVar16[1] == '-')) {
                        pcVar27 = pcVar16 + 2;
                      }
                    }
                    if (pcVar27 == pcVar16) {
                      bVar6 = false;
                    }
                    else {
                      std::__cxx11::string::string((string *)local_4d8,pcVar27,&local_4e1);
                      ppcVar21 = std::find_if<char_const*const*,cmStrCmp>
                                           ((char **)
                                                  RccMergeOptions(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,bool)
                                                  ::valueOptions,cmCacheEntryTypes,
                                            (cmStrCmp *)local_4d8);
                      bVar6 = ppcVar21 != cmCacheEntryTypes;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_4d8._0_8_ != &local_4c8) {
                        operator_delete((void *)local_4d8._0_8_,
                                        CONCAT17(local_4c8._M_local_buf[7],
                                                 CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                                          CONCAT21(local_4c8._M_allocated_capacity.
                                                                   _1_2_,local_4c8._M_local_buf[0]))
                                                ) + 1);
                      }
                    }
                    if (((bVar6) &&
                        (_Var20._M_current + 1 !=
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_518._8_8_)) &&
                       (__x + 1 !=
                        local_2b8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish)) {
                      std::__cxx11::string::_M_assign((string *)(_Var20._M_current + 1));
                      __x = __x + 1;
                    }
                  }
                }
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           local_518,local_518._8_8_,local_548._M_dataplus._M_p,
                           local_548._M_string_length);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_548);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_2b8);
              }
              if (local_518._0_8_ != local_518._8_8_) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&local_1c8,(value_type *)local_578);
                cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                          ((string *)local_4d8,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_518,cmQtAutoGeneratorCommon::listSep);
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &local_108,(string *)local_4d8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4d8._0_8_ != &local_4c8) {
                  operator_delete((void *)local_4d8._0_8_,
                                  CONCAT17(local_4c8._M_local_buf[7],
                                           CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                                    CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                                             local_4c8._M_local_buf[0]))) + 1);
                }
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_518);
              if ((string *)local_578._0_8_ != (string *)(local_578 + 0x10)) {
                operator_delete((void *)local_578._0_8_,local_578._16_8_ + 1);
              }
            }
          }
        }
        ppcVar28 = ppcVar28 + 1;
      } while (ppcVar28 !=
               local_208.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl
               .super__Vector_impl_data._M_finish);
    }
    pcVar2 = local_4f0;
    AddDefinitionEscaped(local_4f0,"_qt_rcc_executable",&local_5a8);
    AddDefinitionEscaped(pcVar2,"_rcc_files",&local_278);
    AddDefinitionEscaped
              (pcVar2,"_rcc_inputs",
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_298);
    AddDefinitionEscaped(pcVar2,"_rcc_options_files",&local_1c8);
    AddDefinitionEscaped(pcVar2,"_rcc_options_options",&local_108);
    if (local_208.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_208.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_208.
                            super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_208.
                            super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_128);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_108);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1c8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_298);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_278);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
      operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_228);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_188);
LAB_002d6d2d:
  GetAutogenTargetBuildDir_abi_cxx11_((string *)local_4d8,local_580);
  AddDefinitionEscaped(local_4e0,"_autogen_build_dir",(string *)local_4d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8._0_8_ != &local_4c8) {
    operator_delete((void *)local_4d8._0_8_,
                    CONCAT17(local_4c8._M_local_buf[7],
                             CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                      CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                               local_4c8._M_local_buf[0]))) + 1);
  }
  pcVar2 = local_4e0;
  AddDefinitionEscaped(local_4e0,"_qt_version_major",&local_250);
  AddDefinitionEscaped(pcVar2,"_sources",&local_148);
  AddDefinitionEscaped(pcVar2,"_headers",&local_168);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_168);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_148);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  GetAutogenTargetFilesDir_abi_cxx11_(&local_5a8,local_580);
  std::__cxx11::string::append((char *)&local_5a8);
  psVar15 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
  local_4d8._0_8_ = &local_4c8;
  pcVar4 = (psVar15->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_4d8,pcVar4,pcVar4 + psVar15->_M_string_length);
  std::__cxx11::string::append(local_4d8);
  uVar5 = local_4d8._0_8_;
  _Var26._M_p = local_5a8._M_dataplus._M_p;
  cmNewLineStyle::cmNewLineStyle(&local_254);
  cmMakefile::ConfigureFile(local_4e0,(char *)uVar5,_Var26._M_p,false,true,false,local_254);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8._0_8_ != &local_4c8) {
    operator_delete((void *)local_4d8._0_8_,
                    CONCAT17(local_4c8._M_local_buf[7],
                             CONCAT43(local_4c8._M_allocated_capacity._3_4_,
                                      CONCAT21(local_4c8._M_allocated_capacity._1_2_,
                                               local_4c8._M_local_buf[0]))) + 1);
  }
  if (((local_60._M_impl.super__Rb_tree_header._M_node_count != 0) ||
      (local_c0._M_impl.super__Rb_tree_header._M_node_count != 0)) ||
     ((local_90._M_impl.super__Rb_tree_header._M_node_count != 0 ||
      (local_f0._M_impl.super__Rb_tree_header._M_node_count != 0)))) {
    local_518._0_8_ = local_518._0_8_ & 0xffffffff00000000;
    cmsys::SystemTools::GetPermissions(&local_5a8,(mode_t *)local_518);
    if (-1 < (char)local_518._0_8_) {
      cmsys::SystemTools::SetPermissions(&local_5a8,local_518._0_4_ | 0x80,false);
    }
    std::ofstream::ofstream(local_4d8,local_5a8._M_dataplus._M_p,_S_app);
    if ((*(byte *)((long)&local_4b8 + *(long *)(local_4d8._0_8_ - 0x18)) & 5) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4d8,"# Configuration specific options\n",0x21);
      if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
          &local_60._M_impl.super__Rb_tree_header) {
        p_Var23 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4d8,"set(AM_CONFIG_SUFFIX_",0x15);
          poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4d8,*(char **)(p_Var23 + 1),
                               (long)p_Var23[1]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>(poVar22," ",1);
          poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar22,*(char **)(p_Var23 + 2),(long)p_Var23[2]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>(poVar22,")\n",2);
          p_Var23 = (_Base_ptr)std::_Rb_tree_increment(p_Var23);
        } while ((_Rb_tree_header *)p_Var23 != &local_60._M_impl.super__Rb_tree_header);
      }
      if ((_Rb_tree_header *)local_c0._M_impl.super__Rb_tree_header._M_header._M_left !=
          &local_c0._M_impl.super__Rb_tree_header) {
        p_Var23 = local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4d8,"set(AM_MOC_DEFINITIONS_",0x17);
          poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4d8,*(char **)(p_Var23 + 1),
                               (long)p_Var23[1]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>(poVar22," ",1);
          poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar22,*(char **)(p_Var23 + 2),(long)p_Var23[2]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>(poVar22,")\n",2);
          p_Var23 = (_Base_ptr)std::_Rb_tree_increment(p_Var23);
        } while ((_Rb_tree_header *)p_Var23 != &local_c0._M_impl.super__Rb_tree_header);
      }
      if ((_Rb_tree_header *)local_90._M_impl.super__Rb_tree_header._M_header._M_left !=
          &local_90._M_impl.super__Rb_tree_header) {
        p_Var23 = local_90._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4d8,"set(AM_MOC_INCLUDES_",0x14);
          poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4d8,*(char **)(p_Var23 + 1),
                               (long)p_Var23[1]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>(poVar22," ",1);
          poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar22,*(char **)(p_Var23 + 2),(long)p_Var23[2]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>(poVar22,")\n",2);
          p_Var23 = (_Base_ptr)std::_Rb_tree_increment(p_Var23);
        } while ((_Rb_tree_header *)p_Var23 != &local_90._M_impl.super__Rb_tree_header);
      }
      if ((_Rb_tree_header *)local_f0._M_impl.super__Rb_tree_header._M_header._M_left !=
          &local_f0._M_impl.super__Rb_tree_header) {
        p_Var23 = local_f0._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4d8,"set(AM_UIC_TARGET_OPTIONS_",0x1a);
          poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4d8,*(char **)(p_Var23 + 1),
                               (long)p_Var23[1]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>(poVar22," ",1);
          poVar22 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar22,*(char **)(p_Var23 + 2),(long)p_Var23[2]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>(poVar22,")\n",2);
          p_Var23 = (_Base_ptr)std::_Rb_tree_increment(p_Var23);
        } while ((_Rb_tree_header *)p_Var23 != &local_f0._M_impl.super__Rb_tree_header);
      }
    }
    else {
      local_578._0_8_ = (string *)(local_578 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_578,"Internal CMake error when trying to open file: ","");
      cmQtAutoGeneratorCommon::Quoted(&local_548,&local_5a8);
      std::__cxx11::string::_M_append(local_578,(ulong)local_548._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_548._M_dataplus._M_p != &local_548.field_2) {
        operator_delete(local_548._M_dataplus._M_p,
                        CONCAT17(local_548.field_2._M_local_buf[7],
                                 CONCAT52(local_548.field_2._M_allocated_capacity._2_5_,
                                          CONCAT11(local_548.field_2._M_local_buf[1],
                                                   local_548.field_2._M_local_buf[0]))) + 1);
      }
      std::__cxx11::string::append(local_578);
      cmSystemTools::Error((char *)local_578._0_8_,(char *)0x0,(char *)0x0,(char *)0x0);
      if ((string *)local_578._0_8_ != (string *)(local_578 + 0x10)) {
        operator_delete((void *)local_578._0_8_,local_578._16_8_ + 1);
      }
    }
    local_4d8._0_8_ = _VTT;
    *(undefined8 *)(local_4d8 + *(long *)(_VTT->_M_local_buf + -0x18)) = _vtable;
    std::filebuf::~filebuf((filebuf *)(local_4d8 + 8));
    std::ios_base::~ios_base(local_3e0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
    operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_f0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_c0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_90);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_60);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,
                    CONCAT71(local_1e8.field_2._M_allocated_capacity._1_7_,
                             local_1e8.field_2._M_local_buf[0]) + 1);
  }
  cmMakefile::PopScope(local_4e0);
  return;
}

Assistant:

void cmQtAutoGeneratorInitializer::SetupAutoGenerateTarget(
  cmGeneratorTarget const* target)
{
  cmMakefile* makefile = target->Target->GetMakefile();

  // forget the variables added here afterwards again:
  cmMakefile::ScopePushPop varScope(makefile);
  static_cast<void>(varScope);

  // Get configurations
  std::string config;
  const std::vector<std::string> configs(GetConfigurations(makefile, &config));

  // Configurations settings buffers
  std::map<std::string, std::string> configSuffix;
  std::map<std::string, std::string> configMocIncludes;
  std::map<std::string, std::string> configMocDefines;
  std::map<std::string, std::string> configUicOptions;

  // Configuration suffix
  if (IsMultiConfig(target->GetGlobalGenerator())) {
    for (std::vector<std::string>::const_iterator it = configs.begin();
         it != configs.end(); ++it) {
      configSuffix[*it] = cmOutputConverter::EscapeForCMake("_" + *it);
    }
  }

  // Basic setup
  {
    const bool mocEnabled = target->GetPropertyAsBool("AUTOMOC");
    const bool uicEnabled = target->GetPropertyAsBool("AUTOUIC");
    const bool rccEnabled = target->GetPropertyAsBool("AUTORCC");
    const std::string autogenTargetName = GetAutogenTargetName(target);
    const std::string qtMajorVersion = GetQtMajorVersion(target);

    std::vector<std::string> sources;
    std::vector<std::string> headers;

    if (mocEnabled || uicEnabled || rccEnabled) {
      std::vector<std::string> mocSkipList;
      std::vector<std::string> uicSkipList;
      AcquireScanFiles(target, sources, headers, mocSkipList, uicSkipList);
      if (mocEnabled) {
        MocSetupAutoTarget(target, autogenTargetName, qtMajorVersion, config,
                           configs, mocSkipList, configMocIncludes,
                           configMocDefines);
      }
      if (uicEnabled) {
        UicSetupAutoTarget(target, qtMajorVersion, config, configs,
                           uicSkipList, configUicOptions);
      }
      if (rccEnabled) {
        RccSetupAutoTarget(target, qtMajorVersion);
      }
    }

    AddDefinitionEscaped(makefile, "_autogen_build_dir",
                         GetAutogenTargetBuildDir(target));
    AddDefinitionEscaped(makefile, "_qt_version_major", qtMajorVersion);
    AddDefinitionEscaped(makefile, "_sources", sources);
    AddDefinitionEscaped(makefile, "_headers", headers);
  }

  // Generate info file
  std::string infoFile = GetAutogenTargetFilesDir(target);
  infoFile += "/AutogenInfo.cmake";
  {
    std::string inf = cmSystemTools::GetCMakeRoot();
    inf += "/Modules/AutogenInfo.cmake.in";
    makefile->ConfigureFile(inf.c_str(), infoFile.c_str(), false, true, false);
  }

  // Append custom definitions to info file on demand
  if (!configSuffix.empty() || !configMocDefines.empty() ||
      !configMocIncludes.empty() || !configUicOptions.empty()) {

    // Ensure we have write permission in case .in was read-only.
    mode_t perm = 0;
#if defined(_WIN32) && !defined(__CYGWIN__)
    mode_t mode_write = S_IWRITE;
#else
    mode_t mode_write = S_IWUSR;
#endif
    cmSystemTools::GetPermissions(infoFile, perm);
    if (!(perm & mode_write)) {
      cmSystemTools::SetPermissions(infoFile, perm | mode_write);
    }

    // Open and write file
    cmsys::ofstream ofs(infoFile.c_str(), std::ios::app);
    if (ofs) {
      ofs << "# Configuration specific options\n";
      for (std::map<std::string, std::string>::iterator
             it = configSuffix.begin(),
             end = configSuffix.end();
           it != end; ++it) {
        ofs << "set(AM_CONFIG_SUFFIX_" << it->first << " " << it->second
            << ")\n";
      }
      for (std::map<std::string, std::string>::iterator
             it = configMocDefines.begin(),
             end = configMocDefines.end();
           it != end; ++it) {
        ofs << "set(AM_MOC_DEFINITIONS_" << it->first << " " << it->second
            << ")\n";
      }
      for (std::map<std::string, std::string>::iterator
             it = configMocIncludes.begin(),
             end = configMocIncludes.end();
           it != end; ++it) {
        ofs << "set(AM_MOC_INCLUDES_" << it->first << " " << it->second
            << ")\n";
      }
      for (std::map<std::string, std::string>::iterator
             it = configUicOptions.begin(),
             end = configUicOptions.end();
           it != end; ++it) {
        ofs << "set(AM_UIC_TARGET_OPTIONS_" << it->first << " " << it->second
            << ")\n";
      }
    } else {
      // File open error
      std::string error = "Internal CMake error when trying to open file: ";
      error += cmQtAutoGeneratorCommon::Quoted(infoFile);
      error += " for writing.";
      cmSystemTools::Error(error.c_str());
    }
  }
}